

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRackpinion.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkRackpinion::ChLinkRackpinion(ChLinkRackpinion *this,ChLinkRackpinion *other)

{
  double dVar1;
  double dVar2;
  double dVar3;
  ChVector<double> local_68;
  ChQuaternion<double> local_48;
  
  ChLinkMateGeneric::ChLinkMateGeneric
            (&this->super_ChLinkMateGeneric,&other->super_ChLinkMateGeneric);
  (this->super_ChLinkMateGeneric).super_ChLinkMate.super_ChLink.super_ChLinkBase.super_ChPhysicsItem
  .super_ChObj._vptr_ChObj = (_func_int **)&PTR__ChLinkRackpinion_01168d68;
  (this->contact_pt).m_data[0] = 0.0;
  (this->contact_pt).m_data[1] = 0.0;
  (this->contact_pt).m_data[2] = 0.0;
  local_48.m_data[0] = 1.0;
  local_68.m_data[2] = 0.0;
  local_48.m_data[3] = 0.0;
  local_68.m_data[0] = 0.0;
  local_68.m_data[1] = 0.0;
  local_48.m_data[1] = 0.0;
  local_48.m_data[2] = 0.0;
  ChFrame<double>::ChFrame(&this->local_pinion,&local_68,&local_48);
  local_68.m_data[2] = 0.0;
  local_48.m_data[0] = 1.0;
  local_48.m_data[3] = 0.0;
  local_68.m_data[0] = 0.0;
  local_68.m_data[1] = 0.0;
  local_48.m_data[1] = 0.0;
  local_48.m_data[2] = 0.0;
  ChFrame<double>::ChFrame(&this->local_rack,&local_68,&local_48);
  dVar1 = other->alpha;
  dVar2 = other->beta;
  dVar3 = other->phase;
  this->R = other->R;
  this->alpha = dVar1;
  this->beta = dVar2;
  this->phase = dVar3;
  this->a1 = other->a1;
  this->checkphase = other->checkphase;
  if (other != this) {
    (this->contact_pt).m_data[0] = (other->contact_pt).m_data[0];
    (this->contact_pt).m_data[1] = (other->contact_pt).m_data[1];
    (this->contact_pt).m_data[2] = (other->contact_pt).m_data[2];
  }
  ChFrame<double>::operator=(&this->local_pinion,&other->local_pinion);
  ChFrame<double>::operator=(&this->local_rack,&other->local_rack);
  return;
}

Assistant:

ChLinkRackpinion::ChLinkRackpinion(const ChLinkRackpinion& other) : ChLinkMateGeneric(other) {
    R = other.R;
    alpha = other.alpha;
    beta = other.beta;
    phase = other.phase;
    a1 = other.a1;
    checkphase = other.checkphase;

    contact_pt = other.contact_pt;
    local_pinion = other.local_pinion;
    local_rack = other.local_rack;
}